

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::WATParser::TypeUse> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::makeTypeUse
          (Result<wasm::WATParser::TypeUse> *__return_storage_ptr__,ParseModuleTypesCtx *this,
          Index pos,
          optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
          type,ParamsT *params,ResultsT *results)

{
  bool bVar1;
  size_type __n;
  HeapTypeT *this_00;
  pointer pvVar2;
  TypeUse local_d0;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false> local_b0;
  _Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false> local_a8;
  const_iterator it;
  TypeUse local_98;
  reference local_78;
  NameType *p;
  iterator __end3;
  iterator __begin3;
  ParamsT *__range3;
  undefined1 local_48 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> ids;
  ResultsT *results_local;
  ParamsT *params_local;
  ParseModuleTypesCtx *pPStack_18;
  Index pos_local;
  ParseModuleTypesCtx *this_local;
  
  ids.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)results;
  params_local._4_4_ = pos;
  pPStack_18 = this;
  this_local = (ParseModuleTypesCtx *)__return_storage_ptr__;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_48);
  if (params != (ParamsT *)0x0) {
    __n = std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::size(params);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::reserve
              ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_48,__n);
    __end3 = std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::begin(params);
    p = (NameType *)std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::end(params);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                                       *)&p), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                 ::operator*(&__end3);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_48,&local_78->name);
      __gnu_cxx::
      __normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
      ::operator++(&__end3);
    }
  }
  bVar1 = std::optional::operator_cast_to_bool((optional *)&type);
  if (bVar1) {
    this_00 = std::
              optional<wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseModuleTypesCtx>::HeapTypeT>
              ::operator*(&type);
    local_98.type = TypeParserCtx::HeapTypeT::operator_cast_to_HeapType((HeapTypeT *)this_00);
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_98.names,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_48);
    Result<wasm::WATParser::TypeUse>::Result<wasm::WATParser::TypeUse>
              (__return_storage_ptr__,&local_98);
    TypeUse::~TypeUse(&local_98);
  }
  else {
    local_a8._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
         ::find(this->implicitTypes,(key_type *)((long)&params_local + 4));
    local_b0._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_wasm::HeapType,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::HeapType>_>_>
         ::end(this->implicitTypes);
    bVar1 = std::__detail::operator!=(&local_a8,&local_b0);
    if (!bVar1) {
      __assert_fail("it != implicitTypes.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/parser/contexts.h"
                    ,0x527,
                    "Result<TypeUseT> wasm::WATParser::ParseModuleTypesCtx::makeTypeUse(Index, std::optional<HeapTypeT>, ParamsT *, ResultsT *)"
                   );
    }
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_wasm::HeapType>,_false,_false>::
             operator->((_Node_const_iterator<std::pair<const_unsigned_int,_wasm::HeapType>,_false,_false>
                         *)&local_a8);
    local_d0.type.id = (pvVar2->second).id;
    std::vector<wasm::Name,_std::allocator<wasm::Name>_>::vector
              (&local_d0.names,(vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_48);
    Result<wasm::WATParser::TypeUse>::Result<wasm::WATParser::TypeUse>
              (__return_storage_ptr__,&local_d0);
    TypeUse::~TypeUse(&local_d0);
  }
  it.super__Node_iterator_base<std::pair<const_unsigned_int,_wasm::HeapType>,_false>._M_cur._4_4_ =
       1;
  std::vector<wasm::Name,_std::allocator<wasm::Name>_>::~vector
            ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result<TypeUseT> makeTypeUse(Index pos,
                               std::optional<HeapTypeT> type,
                               ParamsT* params,
                               ResultsT* results) {
    std::vector<Name> ids;
    if (params) {
      ids.reserve(params->size());
      for (auto& p : *params) {
        ids.push_back(p.name);
      }
    }

    if (type) {
      return TypeUse{*type, ids};
    }

    auto it = implicitTypes.find(pos);
    assert(it != implicitTypes.end());

    return TypeUse{it->second, ids};
  }